

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_array(CPState *cp,CPDecl *decl)

{
  int iVar1;
  CTSize local_20;
  CTInfo local_1c;
  CTSize nelem;
  CTInfo info;
  CPDecl *decl_local;
  CPState *cp_local;
  
  local_1c = 0x30000000;
  local_20 = 0xffffffff;
  cp_decl_attributes(cp,decl);
  iVar1 = cp_opt(cp,0x3f);
  if (iVar1 == 0) {
    if (cp->tok != 0x5d) {
      local_20 = cp_expr_ksize(cp);
    }
  }
  else {
    local_1c = 0x30100000;
  }
  cp_check(cp,0x5d);
  cp_add(decl,local_1c,local_20);
  return;
}

Assistant:

static void cp_decl_array(CPState *cp, CPDecl *decl)
{
  CTInfo info = CTINFO(CT_ARRAY, 0);
  CTSize nelem = CTSIZE_INVALID;  /* Default size for a[] or a[?]. */
  cp_decl_attributes(cp, decl);
  if (cp_opt(cp, '?'))
    info |= CTF_VLA;  /* Create variable-length array a[?]. */
  else if (cp->tok != ']')
    nelem = cp_expr_ksize(cp);
  cp_check(cp, ']');
  cp_add(decl, info, nelem);
}